

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

void math::wide_integer::uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false>::
     eval_multiply_n_by_n_to_2n<unsigned_int*,unsigned_int_const*,unsigned_int_const*>
               (uint *r,uint *a,uint *b,unsigned_fast_type count)

{
  int iVar1;
  unsigned_fast_type uVar2;
  unsigned_fast_type uVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar1 = (int)count * 2;
  if (iVar1 != 0) {
    memset(r,0,(long)iVar1 << 2);
  }
  if (count != 0) {
    uVar2 = 0;
    do {
      if (*a != 0) {
        uVar3 = 0;
        uVar4 = 0;
        do {
          uVar5 = r[uVar3] + uVar4 + (ulong)b[uVar3] * (ulong)*a;
          r[uVar3] = (uint)uVar5;
          uVar4 = uVar5 >> 0x20;
          uVar3 = uVar3 + 1;
        } while (count != uVar3);
        r[uVar3] = (uint)(uVar5 >> 0x20);
      }
      a = a + 1;
      uVar2 = uVar2 + 1;
      r = r + 1;
    } while (uVar2 != count);
  }
  return;
}

Assistant:

static constexpr auto eval_multiply_n_by_n_to_2n(      ResultIterator     r,
                                                           InputIteratorLeft  a,
                                                           InputIteratorRight b,
                                                     const unsigned_fast_type count) -> void
    {
      static_assert
      (
           (std::numeric_limits<typename detail::iterator_detail::iterator_traits<ResultIterator>::value_type>::digits == std::numeric_limits<typename detail::iterator_detail::iterator_traits<InputIteratorLeft>::value_type>::digits)
        && (std::numeric_limits<typename detail::iterator_detail::iterator_traits<ResultIterator>::value_type>::digits == std::numeric_limits<typename detail::iterator_detail::iterator_traits<InputIteratorRight>::value_type>::digits),
        "Error: Internals require same widths for left-right-result limb_types at the moment"
      );

      using local_limb_type = typename detail::iterator_detail::iterator_traits<ResultIterator>::value_type;

      using local_double_limb_type =
        typename detail::uint_type_helper<static_cast<size_t>(std::numeric_limits<local_limb_type>::digits * 2)>::exact_unsigned_type;

      detail::fill_unsafe(r, detail::advance_and_point(r, static_cast<size_t>(count * 2U)), static_cast<local_limb_type>(UINT8_C(0)));

      for(auto i = static_cast<unsigned_fast_type>(UINT8_C(0)); i < count; ++i)
      {
        if(*a != static_cast<local_limb_type>(UINT8_C(0)))
        {
          auto carry = static_cast<local_double_limb_type>(UINT8_C(0));

          auto r_i_plus_j = detail::advance_and_point(r, i); // NOLINT(llvm-qualified-auto,readability-qualified-auto)
          auto bj         = b;                               // NOLINT(llvm-qualified-auto,readability-qualified-auto)

          for(auto j = static_cast<unsigned_fast_type>(UINT8_C(0)); j < count; ++j)
          {
            carry =
              static_cast<local_double_limb_type>
              (
                  static_cast<local_double_limb_type>
                  (
                      carry
                    + static_cast<local_double_limb_type>(static_cast<local_double_limb_type>(*a) * *bj++)
                  )
                + *r_i_plus_j
              );

            *r_i_plus_j++ = static_cast<local_limb_type>(carry);
            carry         = detail::make_hi<local_limb_type>(carry);
          }

          *r_i_plus_j = static_cast<local_limb_type>(carry);
        }

        ++a;
      }
    }